

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

quaternion * quaternion_multiply(quaternion *self,quaternion *qT)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = (self->field_0).q[3];
  dVar2 = (qT->field_0).q[3];
  dVar3 = (self->field_0).q[0];
  dVar4 = (self->field_0).q[1];
  dVar5 = (qT->field_0).q[0];
  dVar6 = (qT->field_0).q[2];
  dVar7 = (self->field_0).q[2];
  dVar8 = (qT->field_0).q[1];
  (self->field_0).q[0] = (dVar4 * dVar6 + dVar1 * dVar5 + dVar3 * dVar2) - dVar7 * dVar8;
  (self->field_0).q[1] = dVar7 * dVar5 + dVar4 * dVar2 + (dVar1 * dVar8 - dVar6 * dVar3);
  (self->field_0).q[2] = dVar7 * dVar2 + ((dVar1 * dVar6 + dVar3 * dVar8) - dVar4 * dVar5);
  (self->field_0).q[3] = ((dVar1 * dVar2 - dVar5 * dVar3) - dVar4 * dVar8) - dVar7 * dVar6;
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_multiply(struct quaternion *self, const struct quaternion *qT)
{
	/* qT is the multiplicand */

	struct quaternion r;

	r.x = self->w * qT->x + self->x * qT->w + self->y * qT->z - self->z * qT->y;
	r.y = self->w * qT->y - self->x * qT->z + self->y * qT->w + self->z * qT->x;
	r.z = self->w * qT->z + self->x * qT->y - self->y * qT->x + self->z * qT->w;
	r.w = self->w * qT->w - self->x * qT->x - self->y * qT->y - self->z * qT->z;

	quaternion_set(self, &r); /* overwrite/save it */

	return self;
}